

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_catalog.cpp
# Opt level: O3

void __thiscall SystemCatalog::SystemCatalog(SystemCatalog *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  long *plVar4;
  SystemCatalog *this_00;
  long *plVar5;
  fstream *__nbytes;
  void *__buf;
  fstream *this_01;
  int iVar6;
  type _type;
  long *local_288;
  long local_280;
  long local_278;
  long lStack_270;
  long *local_268 [2];
  long local_258 [2];
  undefined1 local_248 [40];
  size_t local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210 [20];
  
  p_Var1 = &(this->types)._M_t._M_impl.super__Rb_tree_header;
  (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->types)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_01 = &this->catalogFile;
  std::fstream::fstream(this_01);
  local_268[0] = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"data/","");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_268);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_278 = *plVar5;
    lStack_270 = plVar4[3];
    local_288 = &local_278;
  }
  else {
    local_278 = *plVar5;
    local_288 = (long *)*plVar4;
  }
  local_280 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::fstream::fstream(local_248,(string *)&local_288,_S_out|_S_in|_S_bin);
  std::fstream::operator=(this_01,(fstream *)local_248);
  std::fstream::~fstream(local_248);
  if (local_288 != &local_278) {
    operator_delete(local_288,local_278 + 1);
  }
  if (local_268[0] != local_258) {
    operator_delete(local_268[0],local_258[0] + 1);
  }
  __nbytes = this_01;
  if (((&this->field_0x58)[*(long *)(*(long *)this_01 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "SystemCatalog file could not be found or read, creating a new one",0x41);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    this_00 = (SystemCatalog *)std::ostream::put(-0x58);
    std::ostream::flush();
    createCatalogFile(this_00);
    local_268[0] = local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"data/","");
    plVar4 = (long *)std::__cxx11::string::append((char *)local_268);
    __nbytes = (fstream *)(plVar4 + 2);
    if ((fstream *)*plVar4 == __nbytes) {
      local_278 = *(long *)__nbytes;
      lStack_270 = plVar4[3];
      local_288 = &local_278;
    }
    else {
      local_278 = *(long *)__nbytes;
      local_288 = (long *)*plVar4;
    }
    local_280 = plVar4[1];
    *plVar4 = (long)__nbytes;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::fstream::fstream(local_248,(string *)&local_288,_S_out|_S_in|_S_bin);
    std::fstream::operator=(this_01,(fstream *)local_248);
    std::fstream::~fstream(local_248);
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278 + 1);
    }
    if (local_268[0] != local_258) {
      operator_delete(local_268[0],local_258[0] + 1);
    }
  }
  std::istream::read((char *)this_01,(long)this);
  p_Var2 = (_Base_ptr)(local_248 + 8);
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = 0;
  local_248._16_8_ = (_Base_ptr)0x0;
  local_220 = 0;
  local_248._24_8_ = p_Var2;
  local_248._32_8_ = p_Var2;
  std::_Rb_tree<type,_type,_std::_Identity<type>,_std::less<type>,_std::allocator<type>_>::clear
            (&(this->types)._M_t);
  if ((_Base_ptr)local_248._16_8_ != (_Base_ptr)0x0) {
    __nbytes = (fstream *)(local_248._8_8_ & 0xffffffff);
    (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_248._8_4_;
    (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)local_248._16_8_;
    (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_248._24_8_
    ;
    (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)local_248._32_8_;
    *(_Rb_tree_header **)(local_248._16_8_ + 8) = p_Var1;
    (this->types)._M_t._M_impl.super__Rb_tree_header._M_node_count = local_220;
    local_248._16_8_ = (_Base_ptr)0x0;
    local_220 = 0;
    local_248._24_8_ = p_Var2;
    local_248._32_8_ = p_Var2;
  }
  std::_Rb_tree<type,_type,_std::_Identity<type>,_std::less<type>,_std::allocator<type>_>::~_Rb_tree
            ((_Rb_tree<type,_type,_std::_Identity<type>,_std::less<type>,_std::allocator<type>_> *)
             local_248);
  if (0 < this->numTypes) {
    __buf = (void *)0x4;
    iVar6 = 0;
    do {
      type::type((type *)local_248);
      type::read((type *)local_248,(int)this_01,__buf,(size_t)__nbytes);
      std::_Rb_tree<type,type,std::_Identity<type>,std::less<type>,std::allocator<type>>::
      _M_insert_unique<type_const&>
                ((_Rb_tree<type,type,std::_Identity<type>,std::less<type>,std::allocator<type>> *)
                 &this->types,(type *)local_248);
      iVar3 = calcTypeSize((uint)local_248[0x20]);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_210);
      if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
      }
      __buf = (void *)(ulong)(uint)((int)__buf + iVar3);
      iVar6 = iVar6 + 1;
    } while (iVar6 < this->numTypes);
  }
  return;
}

Assistant:

SystemCatalog::SystemCatalog() {
    catalogFile = fstream(ROOT + "SystemCatalog", INOUTBIN);

    if (!catalogFile) {
        cout << "SystemCatalog file could not be found or read, creating a new one" << endl;

        this->createCatalogFile();

        catalogFile = fstream(ROOT + "SystemCatalog", INOUTBIN);
    }

    catalogFile.read((char *) &numTypes, NUM_TYPES);

    types = set<type>();

    int offset = NUM_TYPES;

    for (int i = 0; i < numTypes; ++i) {

        type _type = type();

        _type.read(catalogFile, offset);

        types.insert(_type);

        offset += calcTypeSize(_type.numFields);
    }
}